

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Reals *quality,Read<signed_char> *candidates)

{
  bool bVar1;
  Int IVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Read<signed_char> RVar4;
  Read<signed_char> local_a0;
  Read<double> local_90 [2];
  Graph local_70;
  undefined1 local_50 [8];
  Graph graph;
  Read<signed_char> *candidates_local;
  Reals *quality_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  graph.ab2b.write_.shared_alloc_.direct_ptr = candidates;
  IVar2 = Mesh::dim(mesh);
  if (ent_dim == IVar2) {
    Read<signed_char>::Read((Read<signed_char> *)this,candidates);
    pvVar3 = extraout_RDX;
  }
  else {
    Mesh::owners_have_all_upward(mesh,ent_dim);
    bVar1 = Mesh::owners_have_all_upward(mesh,ent_dim);
    if (!bVar1) {
      fail("assertion %s failed at %s +%d\n","mesh->owners_have_all_upward(ent_dim)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_indset.cpp"
           ,0x1f);
    }
    Mesh::ask_star((Graph *)local_50,mesh,ent_dim);
    Graph::Graph(&local_70,(Graph *)local_50);
    Read<double>::Read(local_90,quality);
    Read<signed_char>::Read(&local_a0,candidates);
    find_indset(this,mesh,ent_dim,&local_70,local_90,&local_a0);
    Read<signed_char>::~Read(&local_a0);
    Read<double>::~Read(local_90);
    Graph::~Graph(&local_70);
    Graph::~Graph((Graph *)local_50);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Reals quality, Read<I8> candidates) {
  if (ent_dim == mesh->dim()) return candidates;
  mesh->owners_have_all_upward(ent_dim);
  OMEGA_H_CHECK(mesh->owners_have_all_upward(ent_dim));
  auto graph = mesh->ask_star(ent_dim);
  return find_indset(mesh, ent_dim, graph, quality, candidates);
}